

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O0

SimpleRF64Header * __thiscall
ASDCP::RF64::SimpleRF64Header::ReadFromFile
          (SimpleRF64Header *this,IFileReader *InFile,ui32_t *data_start)

{
  ui32_t uVar1;
  int iVar2;
  byte_t *pbVar3;
  ILogSink *this_00;
  SimpleRF64Header local_d8 [3];
  undefined1 local_59;
  undefined1 local_58 [8];
  FrameBuffer TmpBuffer;
  ui32_t local_data_start;
  ui32_t read_count;
  ui32_t *data_start_local;
  IFileReader *InFile_local;
  SimpleRF64Header *this_local;
  Result_t *result;
  
  TmpBuffer.super_FrameBuffer.m_PlaintextOffset = 0;
  TmpBuffer.super_FrameBuffer.m_SourceLength = 0;
  PCM::FrameBuffer::FrameBuffer((FrameBuffer *)local_58,0x8000);
  local_59 = 0;
  pbVar3 = FrameBuffer::Data((FrameBuffer *)local_58);
  uVar1 = FrameBuffer::Capacity((FrameBuffer *)local_58);
  (**(code **)(*(long *)data_start + 0x38))
            (this,data_start,pbVar3,uVar1,&TmpBuffer.super_FrameBuffer.m_PlaintextOffset);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar2 < 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Failed to read %d bytes from file\n",0x8000);
  }
  else {
    pbVar3 = FrameBuffer::RoData((FrameBuffer *)local_58);
    ReadFromBuffer(local_d8,(byte_t *)InFile,(ui32_t)pbVar3,
                   (ui32_t *)(ulong)TmpBuffer.super_FrameBuffer.m_PlaintextOffset);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_d8);
    Kumu::Result_t::~Result_t((Result_t *)local_d8);
  }
  local_59 = 1;
  PCM::FrameBuffer::~FrameBuffer((FrameBuffer *)local_58);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::RF64::SimpleRF64Header::ReadFromFile(const Kumu::IFileReader& InFile, ui32_t* data_start)
{
  ui32_t read_count = 0;
  ui32_t local_data_start = 0;
  ASDCP::PCM::FrameBuffer TmpBuffer(Wav::MaxWavHeader);

  if ( data_start == 0 )
    data_start = &local_data_start;

  Result_t result = InFile.Read(TmpBuffer.Data(), TmpBuffer.Capacity(), &read_count);

  if ( ASDCP_SUCCESS(result) )
    result = ReadFromBuffer(TmpBuffer.RoData(), read_count, data_start);
  else
    DefaultLogSink().Error("Failed to read %d bytes from file\n", Wav::MaxWavHeader);

  return result;
}